

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O1

Value * __thiscall Kgc::allocSpecial(Kgc *this,ValueType type)

{
  pointer ppVVar1;
  Value *pVVar2;
  undefined **ppuVar3;
  
  ppVVar1 = this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar1) {
    switch(type) {
    case BOOLEAN:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = BOOLEAN;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2->_vptr_Value = (_func_int **)&PTR__Value_00113d08;
      *(undefined1 *)&pVVar2[1]._vptr_Value = 0;
      return pVVar2;
    case STRING:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = STRING;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      ppuVar3 = &PTR__Value_00113d40;
      break;
    case NIL:
      pVVar2 = (Value *)operator_new(0x18);
      pVVar2->type_ = NIL;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      ppuVar3 = &PTR__Value_00113c98;
      break;
    case CELL:
      pVVar2 = (Value *)operator_new(0x28);
      pVVar2->type_ = CELL;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2->_vptr_Value = (_func_int **)&PTR__Value_00113bb8;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      pVVar2[1].type_ = BOOLEAN;
      pVVar2[1].marked_ = 0;
      return pVVar2;
    case SYMBOL:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = SYMBOL;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      ppuVar3 = &PTR__Value_00113d78;
      break;
    case PRIM_PROC:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = PRIM_PROC;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      ppuVar3 = &PTR__Value_00113c60;
      break;
    case COMP_PROC:
      pVVar2 = (Value *)operator_new(0x30);
      pVVar2->type_ = COMP_PROC;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2->_vptr_Value = (_func_int **)&PTR__Value_00113b50;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      pVVar2[1].type_ = BOOLEAN;
      pVVar2[1].marked_ = 0;
      pVVar2[1].next_ = (Value *)0x0;
      return pVVar2;
    case INPUT_PORT:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = INPUT_PORT;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      ppuVar3 = &PTR__InputPort_00113bf0;
      break;
    case OUTPUT_PORT:
      pVVar2 = (Value *)operator_new(0x20);
      pVVar2->type_ = INPUT_PORT;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      pVVar2[1]._vptr_Value = (_func_int **)0x0;
      ppuVar3 = &PTR__OutputPort_00113c28;
      break;
    case EOF_OBJECT:
      pVVar2 = (Value *)operator_new(0x18);
      pVVar2->type_ = EOF_OBJECT;
      pVVar2->marked_ = 0;
      pVVar2->next_ = (Value *)0x0;
      ppuVar3 = &PTR__Value_00113cd0;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jfourkiotis[P]kat/kgc.cpp"
                    ,0x94,"Value *Kgc::allocNew(ValueType)");
    }
    pVVar2->_vptr_Value = (_func_int **)ppuVar3;
    return pVVar2;
  }
  pVVar2 = ppVVar1[-1];
  this->reserved[(int)type].super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar1 + -1;
  return pVVar2;
}

Assistant:

Value* Kgc::allocSpecial(ValueType type)
{
    std::vector<Value *> &v = reserved[(int)type];
    
    if (!v.empty())
    {
        Value *last = v.back();
        v.pop_back();
        return last;
    }
    return allocNew(type);
}